

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_ccb0f7::ResizeTest::~ResizeTest(ResizeTest *this)

{
  undefined8 *in_RDI;
  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  *unaff_retaddr;
  
  *in_RDI = &PTR__ResizeTest_01f84690;
  in_RDI[2] = &PTR__ResizeTest_01f846e0;
  in_RDI[3] = &PTR__ResizeTest_01f84700;
  std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>::
  ~vector(unaff_retaddr);
  libaom_test::EncoderTest::~EncoderTest((EncoderTest *)0x8d67eb);
  libaom_test::CodecTestWithParam<libaom_test::TestMode>::~CodecTestWithParam
            ((CodecTestWithParam<libaom_test::TestMode> *)0x8d67f5);
  return;
}

Assistant:

~ResizeTest() override = default;